

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDwaLookups.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_e7d6e::LutHeaderWorker::LutHeaderWorker
          (LutHeaderWorker *this,size_t startValue,size_t endValue)

{
  undefined1 auVar1 [16];
  size_t sVar2;
  ulong uVar3;
  size_t *psVar4;
  unsigned_short *puVar5;
  size_t in_RDX;
  size_t in_RSI;
  LutHeaderWorker *in_RDI;
  
  in_RDI->_lastCandidateCount = 0;
  in_RDI->_startValue = in_RSI;
  in_RDI->_endValue = in_RDX;
  in_RDI->_numElements = 0;
  sVar2 = numValues(in_RDI);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = sVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  psVar4 = (size_t *)operator_new__(uVar3);
  in_RDI->_offset = psVar4;
  puVar5 = (unsigned_short *)operator_new__(0x400000);
  in_RDI->_elements = puVar5;
  return;
}

Assistant:

LutHeaderWorker (size_t startValue, size_t endValue)
        : _lastCandidateCount (0)
        , _startValue (startValue)
        , _endValue (endValue)
        , _numElements (0)
        , _offset (new size_t[numValues ()])
        , _elements (new unsigned short[1024 * 1024 * 2])
    {}